

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileNumLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  sxi32 sVar1;
  sxi64 iVal;
  jx9_value *pjVar2;
  jx9_value *pObj_1;
  sxi64 iValue;
  jx9_value *pObj;
  SyToken *pSStack_28;
  sxu32 nIdx;
  SyToken *pToken;
  jx9_gen_state *pjStack_18;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  pSStack_28 = pGen->pIn;
  pObj._4_4_ = 0;
  pToken._4_4_ = iCompileFlag;
  pjStack_18 = pGen;
  if ((pSStack_28->nType & 1) == 0) {
    pjVar2 = jx9VmReserveConstObj(pGen->pVm,(sxu32 *)((long)&pObj + 4));
    if (pjVar2 == (jx9_value *)0x0) {
      sVar1 = GenStateOutOfMem(pjStack_18);
      return sVar1;
    }
    jx9MemObjInitFromString(pjStack_18->pVm,pjVar2,&pSStack_28->sData);
    jx9MemObjToReal(pjVar2);
  }
  else {
    iVal = jx9TokenValueToInt64(&pSStack_28->sData);
    pjVar2 = GenStateInstallNumLiteral(pjStack_18,(sxu32 *)((long)&pObj + 4));
    if (pjVar2 == (jx9_value *)0x0) {
      return -10;
    }
    jx9MemObjInitFromInt(pjStack_18->pVm,pjVar2,iVal);
  }
  jx9VmEmitInstr(pjStack_18->pVm,4,0,pObj._4_4_,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

static sxi32 jx9CompileNumLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyToken *pToken = pGen->pIn; /* Raw token */
	sxu32 nIdx = 0;
	if( pToken->nType & JX9_TK_INTEGER ){
		jx9_value *pObj;
		sxi64 iValue;
		iValue = jx9TokenValueToInt64(&pToken->sData);
		pObj = GenStateInstallNumLiteral(&(*pGen), &nIdx);
		if( pObj == 0 ){
			SXUNUSED(iCompileFlag); /* cc warning */
			return SXERR_ABORT;
		}
		jx9MemObjInitFromInt(pGen->pVm, pObj, iValue);
	}else{
		/* Real number */
		jx9_value *pObj;
		/* Reserve a new constant */
		pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
		if( pObj == 0 ){
			return GenStateOutOfMem(pGen);
		}
		jx9MemObjInitFromString(pGen->pVm, pObj, &pToken->sData);
		jx9MemObjToReal(pObj);
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}